

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O1

bool __thiscall
cmCMakePresetsGraphInternal::InListCondition::Evaluate
          (InListCondition *this,MacroExpanderVector *expanders,int version,optional<bool> *out)

{
  pointer pcVar1;
  bool bVar2;
  ExpandMacroResult EVar3;
  int iVar4;
  pointer pbVar5;
  byte bVar6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> item;
  string str;
  string local_78;
  string local_58;
  pointer local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  pcVar1 = (this->String)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (this->String)._M_string_length);
  EVar3 = ExpandMacros(&local_58,expanders,version);
  if (EVar3 == Ignore) {
    bVar6 = 1;
    if ((out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
        _M_engaged == true) {
      (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
      _M_engaged = false;
    }
  }
  else if (EVar3 == Error) {
    bVar6 = 0;
  }
  else {
    pbVar5 = (this->List).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_38 = (this->List).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    bVar7 = pbVar5 == local_38;
    while (bVar6 = (byte)this, !bVar7) {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      pcVar1 = (pbVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar1,pcVar1 + pbVar5->_M_string_length);
      EVar3 = ExpandMacros(&local_78,expanders,version);
      if (EVar3 == Ignore) {
        if ((out->super__Optional_base<bool,_true,_true>)._M_payload.
            super__Optional_payload_base<bool>._M_engaged == true) {
          (out->super__Optional_base<bool,_true,_true>)._M_payload.
          super__Optional_payload_base<bool>._M_engaged = false;
        }
LAB_002675ac:
        this = (InListCondition *)&DAT_00000001;
        bVar2 = false;
      }
      else if (EVar3 == Error) {
        bVar2 = false;
        this = (InListCondition *)0x0;
      }
      else {
        bVar2 = true;
        if ((local_58._M_string_length == local_78._M_string_length) &&
           ((local_58._M_string_length == 0 ||
            (iVar4 = bcmp(local_58._M_dataplus._M_p,local_78._M_dataplus._M_p,
                          local_58._M_string_length), iVar4 == 0)))) {
          (out->super__Optional_base<bool,_true,_true>)._M_payload.
          super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x101;
          goto LAB_002675ac;
        }
      }
      bVar6 = (byte)this;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) break;
      pbVar5 = pbVar5 + 1;
      bVar7 = pbVar5 == local_38;
    }
    if (bVar7) {
      (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool> =
           (_Optional_payload_base<bool>)0x100;
      bVar6 = 1;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool cmCMakePresetsGraphInternal::InListCondition::Evaluate(
  MacroExpanderVector const& expanders, int version,
  cm::optional<bool>& out) const
{
  std::string str = this->String;
  CHECK_EXPAND(out, str, expanders, version);

  for (auto item : this->List) {
    CHECK_EXPAND(out, item, expanders, version);
    if (str == item) {
      out = true;
      return true;
    }
  }

  out = false;
  return true;
}